

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O2

jas_iccattrtab_t * jas_iccattrtab_create(void)

{
  int iVar1;
  jas_iccattrtab_t *tab;
  
  tab = (jas_iccattrtab_t *)jas_malloc(0x10);
  if (tab != (jas_iccattrtab_t *)0x0) {
    tab->numattrs = 0;
    tab->maxattrs = 0;
    tab->attrs = (jas_iccattr_t *)0x0;
    iVar1 = jas_iccattrtab_resize(tab,0x20);
    if (iVar1 == 0) {
      return tab;
    }
    jas_iccattrtab_destroy(tab);
  }
  return (jas_iccattrtab_t *)0x0;
}

Assistant:

static jas_iccattrtab_t *jas_iccattrtab_create()
{
	jas_iccattrtab_t *tab;
	tab = 0;
	if (!(tab = jas_malloc(sizeof(jas_iccattrtab_t))))
		goto error;
	tab->maxattrs = 0;
	tab->numattrs = 0;
	tab->attrs = 0;
	if (jas_iccattrtab_resize(tab, 32))
		goto error;
	return tab;
error:
	if (tab)
		jas_iccattrtab_destroy(tab);
	return 0;
}